

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Value.cpp
# Opt level: O1

void __thiscall luna::Value::Accept(Value *this,GCObjectVisitor *v)

{
  switch(this->type_) {
  case ValueT_Obj:
  case ValueT_String:
  case ValueT_Closure:
  case ValueT_Upvalue:
  case ValueT_Table:
    (*((this->field_0).obj_)->_vptr_GCObject[2])();
    return;
  case ValueT_UserData:
    UserData::Accept((this->field_0).user_data_,v);
    return;
  default:
    return;
  }
}

Assistant:

void Value::Accept(GCObjectVisitor *v) const
    {
        switch (type_)
        {
            case ValueT_Nil:
            case ValueT_Bool:
            case ValueT_Number:
            case ValueT_CFunction:
                break;
            case ValueT_Obj:
                obj_->Accept(v);
                break;
            case ValueT_String:
                str_->Accept(v);
                break;
            case ValueT_Closure:
                closure_->Accept(v);
                break;
            case ValueT_Upvalue:
                upvalue_->Accept(v);
                break;
            case ValueT_Table:
                table_->Accept(v);
                break;
            case ValueT_UserData:
                user_data_->Accept(v);
                break;
        }
    }